

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O3

PaError PaAlsaStream_WaitForFrames(PaAlsaStream *self,unsigned_long *framesAvail,int *xrunOccurred)

{
  snd_pcm_t *psVar1;
  snd_pcm_t *psVar2;
  ulong *puVar3;
  PaError PVar4;
  int iVar5;
  undefined8 extraout_RAX;
  int *piVar6;
  int queryPlayback;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  pollfd *pfds;
  ulong numFrames;
  char *format;
  uint uVar10;
  ulong uVar11;
  pollfd *pfds_00;
  int pollCapture;
  int pollPlayback;
  int pollTimeout;
  int local_64;
  uint local_60;
  uint local_5c;
  ulong *local_58;
  undefined4 local_50;
  int local_4c;
  PaAlsaStreamComponent *local_48;
  PaAlsaStreamComponent *local_40;
  int *local_38;
  
  psVar1 = (self->playback).pcm;
  local_5c = (uint)(psVar1 != (snd_pcm_t *)0x0);
  psVar2 = (self->capture).pcm;
  local_60 = (uint)(psVar2 != (snd_pcm_t *)0x0);
  local_4c = self->pollTimeout;
  local_64 = 0;
  local_58 = framesAvail;
  local_38 = xrunOccurred;
  if (framesAvail == (unsigned_long *)0x0) {
    __assert_fail("framesAvail",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                  ,0xeb2,
                  "PaError PaAlsaStream_WaitForFrames(PaAlsaStream *, unsigned long *, int *)");
  }
  if (self->callbackMode == 0) {
    paUtilErr_ = PaAlsaStream_GetAvailableFrames(self,local_60,local_5c,framesAvail,&local_64);
    if (-1 < paUtilErr_) {
      if (local_64 == 0) {
        if (*local_58 != 0) {
          if ((self->capture).pcm != (snd_pcm_t *)0x0) {
            (self->capture).ready = 1;
          }
          uVar8 = 0;
          iVar5 = local_64;
          if ((self->playback).pcm != (snd_pcm_t *)0x0) {
            (self->playback).ready = 1;
          }
          goto LAB_001123c2;
        }
        goto LAB_00111fcf;
      }
LAB_00112312:
      uVar8 = 0;
      iVar5 = local_64;
      goto LAB_001123c2;
    }
    format = 
    "Expression \'PaAlsaStream_GetAvailableFrames( self, self->capture.pcm != NULL, self->playback.pcm != NULL, framesAvail, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3768\n"
    ;
  }
  else {
LAB_00111fcf:
    local_48 = &self->capture;
    if (psVar1 != (snd_pcm_t *)0x0 || psVar2 != (snd_pcm_t *)0x0) {
      local_40 = &self->playback;
      uVar9 = 0;
      uVar8 = (uint)(psVar1 != (snd_pcm_t *)0x0);
      uVar7 = (uint)(psVar2 != (snd_pcm_t *)0x0);
      do {
        pthread_testcancel();
        if (uVar7 == 0) {
          pfds = (pollfd *)0x0;
          if (uVar8 != 0) {
            uVar10 = 0;
            uVar11 = 0;
            goto LAB_00112038;
          }
          local_50 = (undefined4)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
          uVar10 = 0;
LAB_0011207c:
          pfds_00 = (pollfd *)0x0;
        }
        else {
          pfds = self->pfds;
          PVar4 = PaAlsaStreamComponent_BeginPolling(local_48,pfds);
          paUtilErr_ = 0;
          uVar10 = (self->capture).nfds;
          uVar11 = (ulong)uVar10;
          if (uVar8 == 0) {
            local_50 = (undefined4)CONCAT71((uint7)(uint3)((uint)PVar4 >> 8),1);
            goto LAB_0011207c;
          }
LAB_00112038:
          pfds_00 = self->pfds + uVar11;
          PaAlsaStreamComponent_BeginPolling(local_40,pfds_00);
          paUtilErr_ = 0;
          uVar10 = uVar10 + (self->playback).nfds;
          local_50 = 0;
        }
        if (self->callbackMode != 0) {
          pthread_setcancelstate(0,(int *)0x0);
        }
        iVar5 = poll((pollfd *)self->pfds,(long)(int)uVar10,local_4c);
        if (self->callbackMode != 0) {
          pthread_setcancelstate(1,(int *)0x0);
        }
        if (iVar5 < 0) {
          piVar6 = __errno_location();
          if (*piVar6 != 4) {
            paUtilErr_ = -0x2702;
            format = 
            "Expression \'paInternalError\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3836\n"
            ;
            goto LAB_001123a2;
          }
          Pa_Sleep(1);
        }
        else {
          if (iVar5 == 0) {
            uVar8 = uVar9 + 1;
            if ((0 < (int)uVar9) && (Pa_Sleep(1), 0x7fe < uVar9)) {
              *local_58 = 0;
              uVar8 = 0;
              iVar5 = 1;
              goto LAB_001123c2;
            }
          }
          else {
            if ((uVar7 != 0) &&
               (paUtilErr_ = PaAlsaStreamComponent_EndPolling
                                       (local_48,pfds,(int *)&local_60,&local_64), paUtilErr_ < 0))
            {
              format = 
              "Expression \'PaAlsaStreamComponent_EndPolling( &self->capture, capturePfds, &pollCapture, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3871\n"
              ;
              goto LAB_001123a2;
            }
            if (((char)local_50 == '\0') &&
               (paUtilErr_ = PaAlsaStreamComponent_EndPolling
                                       (local_40,pfds_00,(int *)&local_5c,&local_64), paUtilErr_ < 0
               )) {
              format = 
              "Expression \'PaAlsaStreamComponent_EndPolling( &self->playback, playbackPfds, &pollPlayback, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3875\n"
              ;
              goto LAB_001123a2;
            }
            uVar8 = 0;
            iVar5 = local_64;
            if (local_64 != 0) goto LAB_001123c2;
          }
          uVar9 = uVar8;
          if (((self->capture).pcm != (snd_pcm_t *)0x0) &&
             ((self->playback).pcm != (snd_pcm_t *)0x0)) {
            if (local_5c == 0 && local_60 != 0) {
              paUtilErr_ = ContinuePoll(self,StreamDirection_In,&local_4c,(int *)&local_60);
              if (paUtilErr_ < 0) {
                format = 
                "Expression \'ContinuePoll( self, StreamDirection_In, &pollTimeout, &pollCapture )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3891\n"
                ;
                goto LAB_001123a2;
              }
            }
            else if ((local_60 == 0 && local_5c != 0) &&
                    (paUtilErr_ = ContinuePoll(self,StreamDirection_Out,&local_4c,(int *)&local_5c),
                    paUtilErr_ < 0)) {
              format = 
              "Expression \'ContinuePoll( self, StreamDirection_Out, &pollTimeout, &pollPlayback )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3895\n"
              ;
              goto LAB_001123a2;
            }
          }
        }
        uVar8 = local_5c;
        uVar7 = local_60;
      } while (local_60 != 0 || local_5c != 0);
      if (local_64 != 0) goto LAB_00112312;
    }
    queryPlayback = 0;
    iVar5 = 0;
    if ((self->capture).pcm != (snd_pcm_t *)0x0) {
      iVar5 = (self->capture).ready;
    }
    if ((self->playback).pcm != (snd_pcm_t *)0x0) {
      queryPlayback = (self->playback).ready;
    }
    paUtilErr_ = PaAlsaStream_GetAvailableFrames(self,iVar5,queryPlayback,local_58,&local_64);
    puVar3 = local_58;
    if (-1 < paUtilErr_) {
      iVar5 = local_64;
      if ((self->capture).pcm == (snd_pcm_t *)0x0) {
        if ((self->playback).ready == 0) {
          __assert_fail("self->playback.ready",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                        ,0xf56,
                        "PaError PaAlsaStream_WaitForFrames(PaAlsaStream *, unsigned long *, int *)"
                       );
        }
      }
      else {
        if ((self->playback).pcm != (snd_pcm_t *)0x0) {
          uVar8 = 0;
          if (((self->playback).ready == 0) && (self->neverDropInput == 0)) {
            if ((self->capture).ready == 0) {
              __assert_fail("self->capture.ready",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                            ,0xf4c,
                            "PaError PaAlsaStream_WaitForFrames(PaAlsaStream *, unsigned long *, int *)"
                           );
            }
            uVar11 = (self->capture).framesPerPeriod;
            numFrames = *local_58;
            if (uVar11 < *local_58) {
              numFrames = uVar11;
            }
            PaAlsaStreamComponent_EndProcessing(local_48,numFrames,&local_64);
            *puVar3 = 0;
            (self->capture).ready = 0;
            iVar5 = local_64;
          }
          goto LAB_001123c2;
        }
        if ((self->capture).ready == 0) {
          __assert_fail("self->capture.ready",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                        ,0xf54,
                        "PaError PaAlsaStream_WaitForFrames(PaAlsaStream *, unsigned long *, int *)"
                       );
        }
      }
      uVar8 = 0;
      goto LAB_001123c2;
    }
    format = 
    "Expression \'PaAlsaStream_GetAvailableFrames( self, captureReady, playbackReady, framesAvail, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3909\n"
    ;
  }
LAB_001123a2:
  PaUtil_DebugPrint(format);
  uVar8 = paUtilErr_;
  iVar5 = local_64;
LAB_001123c2:
  do {
    if (iVar5 != 0) {
      paUtilErr_ = PaAlsaStream_HandleXrun(self);
      if (-1 < paUtilErr_) {
        *local_58 = 0;
LAB_00112427:
        *local_38 = iVar5;
        return uVar8;
      }
      PaUtil_DebugPrint(
                       "Expression \'PaAlsaStream_HandleXrun( self )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3934\n"
                       );
      uVar8 = paUtilErr_;
      goto LAB_001123c2;
    }
    if (((*local_58 == 0) || ((self->capture).ready != 0)) || ((self->playback).ready != 0))
    goto LAB_00112427;
    PaUtil_DebugPrint(
                     "Expression \'self->capture.ready || self->playback.ready\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3942\n"
                     );
    uVar8 = 0xffffd8fe;
  } while( true );
}

Assistant:

static PaError PaAlsaStream_WaitForFrames( PaAlsaStream *self, unsigned long *framesAvail, int *xrunOccurred )
{
    PaError result = paNoError;
    int pollPlayback = self->playback.pcm != NULL, pollCapture = self->capture.pcm != NULL;
    int pollTimeout = self->pollTimeout;
    int xrun = 0, timeouts = 0;
    int pollResults;

    assert( self );
    assert( framesAvail );

    if( !self->callbackMode )
    {
        /* In blocking mode we will only wait if necessary */
        PA_ENSURE( PaAlsaStream_GetAvailableFrames( self, self->capture.pcm != NULL, self->playback.pcm != NULL,
                    framesAvail, &xrun ) );
        if( xrun )
        {
            goto end;
        }

        if( *framesAvail > 0 )
        {
            /* Mark pcms ready from poll */
            if( self->capture.pcm )
                self->capture.ready = 1;
            if( self->playback.pcm )
                self->playback.ready = 1;

            goto end;
        }
    }

    while( pollPlayback || pollCapture )
    {
        int totalFds = 0;
        struct pollfd *capturePfds = NULL, *playbackPfds = NULL;

#ifdef PTHREAD_CANCELED
        pthread_testcancel();
#endif
        if( pollCapture )
        {
            capturePfds = self->pfds;
            PA_ENSURE( PaAlsaStreamComponent_BeginPolling( &self->capture, capturePfds ) );
            totalFds += self->capture.nfds;
        }
        if( pollPlayback )
        {
            /* self->pfds is in effect an array of fds; if necessary, index past the capture fds */
            playbackPfds = self->pfds + (pollCapture ? self->capture.nfds : 0);
            PA_ENSURE( PaAlsaStreamComponent_BeginPolling( &self->playback, playbackPfds ) );
            totalFds += self->playback.nfds;
        }

#ifdef PTHREAD_CANCELED
        if( self->callbackMode )
        {
            /* To allow 'Abort' to terminate the callback thread, enable cancelability just for poll() (& disable after) */
            pthread_setcancelstate( PTHREAD_CANCEL_ENABLE, NULL );
        }
#endif

        pollResults = poll( self->pfds, totalFds, pollTimeout );

#ifdef PTHREAD_CANCELED
        if( self->callbackMode )
        {
            pthread_setcancelstate( PTHREAD_CANCEL_DISABLE, NULL );
        }
#endif

        if( pollResults < 0 )
        {
            /*  XXX: Depend on preprocessor condition? */
            if( errno == EINTR )
            {
                /* gdb */
                Pa_Sleep( 1 ); /* avoid hot loop */
                continue;
            }

            /* TODO: Add macro for checking system calls */
            PA_ENSURE( paInternalError );
        }
        else if( pollResults == 0 )
        {
           /* Suspended, paused or failed device can provide 0 poll results. To avoid deadloop in such situation
            * we simply run counter 'timeouts' which detects 0 poll result and accumulates. As soon as 2048 timouts (around 2 seconds)
            * are achieved we simply fail function with paTimedOut to notify waiting methods that device is not capable
            * of providing audio data anymore and needs some corresponding recovery action.
            * Note that 'timeouts' is reset to 0 if poll() managed to return non 0 results.
            */

            /*PA_DEBUG(( "%s: poll == 0 results, timed out, %d times left\n", __FUNCTION__, 2048 - timeouts ));*/
            ++ timeouts;
            if( timeouts > 1 ) /* sometimes device times out, but normally once, so we do not sleep any time */
            {
                Pa_Sleep( 1 ); /* avoid hot loop */
            }
            /* not else ! */
            if( timeouts >= 2048 ) /* audio device not working, shall return error to notify waiters */
            {
                *framesAvail = 0; /* no frames available for processing */
                xrun = 1; /* try recovering device */

                PA_DEBUG(( "%s: poll timed out\n", __FUNCTION__, timeouts ));
                goto end;/*PA_ENSURE( paTimedOut );*/
            }
        }
        else if( pollResults > 0 )
        {
            /* reset timouts counter */
            timeouts = 0;

            /* check the return status of our pfds */
            if( pollCapture )
            {
                PA_ENSURE( PaAlsaStreamComponent_EndPolling( &self->capture, capturePfds, &pollCapture, &xrun ) );
            }
            if( pollPlayback )
            {
                PA_ENSURE( PaAlsaStreamComponent_EndPolling( &self->playback, playbackPfds, &pollPlayback, &xrun ) );
            }
            if( xrun )
            {
                break;
            }
        }

        /* @concern FullDuplex If only one of two pcms is ready we may want to compromise between the two.
         * If there is less than half a period's worth of samples left of frames in the other pcm's buffer we will
         * stop polling.
         */
        if( self->capture.pcm && self->playback.pcm )
        {
            if( pollCapture && !pollPlayback )
            {
                PA_ENSURE( ContinuePoll( self, StreamDirection_In, &pollTimeout, &pollCapture ) );
            }
            else if( pollPlayback && !pollCapture )
            {
                PA_ENSURE( ContinuePoll( self, StreamDirection_Out, &pollTimeout, &pollPlayback ) );
            }
        }
    }

    if( !xrun )
    {
        /* Get the number of available frames for the pcms that are marked ready.
         * @concern FullDuplex If only one direction is marked ready (from poll), the number of frames available for
         * the other direction is returned. Output is normally preferred over capture however, so capture frames may be
         * discarded to avoid overrun unless paNeverDropInput is specified.
         */
        int captureReady = self->capture.pcm ? self->capture.ready : 0,
            playbackReady = self->playback.pcm ? self->playback.ready : 0;
        PA_ENSURE( PaAlsaStream_GetAvailableFrames( self, captureReady, playbackReady, framesAvail, &xrun ) );

        if( self->capture.pcm && self->playback.pcm )
        {
            if( !self->playback.ready && !self->neverDropInput )
            {
                /* Drop input, a period's worth */
                assert( self->capture.ready );
                PaAlsaStreamComponent_EndProcessing( &self->capture, PA_MIN( self->capture.framesPerPeriod,
                            *framesAvail ), &xrun );
                *framesAvail = 0;
                self->capture.ready = 0;
            }
        }
        else if( self->capture.pcm )
            assert( self->capture.ready );
        else
            assert( self->playback.ready );
    }

end:
error:
    if( xrun )
    {
        /* Recover from the xrun state */
        PA_ENSURE( PaAlsaStream_HandleXrun( self ) );
        *framesAvail = 0;
    }
    else
    {
        if( 0 != *framesAvail )
        {
            /* If we're reporting frames eligible for processing, one of the handles better be ready */
            PA_UNLESS( self->capture.ready || self->playback.ready, paInternalError );
        }
    }
    *xrunOccurred = xrun;

    return result;
}